

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O0

IntegrationPointList<1> *
anurbs::IntegrationPoints::get
          (IntegrationPointList<1> *__return_storage_ptr__,size_t degree,Interval *domain)

{
  double dVar1;
  Interval *this;
  bool bVar2;
  IntegrationPointList<1> *this_00;
  __tuple_element_t<0UL,_tuple<double,_double>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<double,_double>_> *p_Var4;
  reference this_01;
  double local_80;
  double local_78;
  tuple<double,_double> local_70;
  reference local_60;
  tuple<double,_double> *norm_point;
  iterator __end2;
  iterator __begin2;
  IntegrationPointList<1> *__range2;
  Index i;
  allocator<std::tuple<double,_double>_> local_22;
  undefined1 local_21;
  Interval *local_20;
  Interval *domain_local;
  size_t degree_local;
  IntegrationPointList<1> *integration_points;
  
  local_21 = 0;
  local_20 = domain;
  domain_local = (Interval *)degree;
  degree_local = (size_t)__return_storage_ptr__;
  std::allocator<std::tuple<double,_double>_>::allocator(&local_22);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::vector
            (__return_storage_ptr__,degree,&local_22);
  std::allocator<std::tuple<double,_double>_>::~allocator(&local_22);
  __range2 = (IntegrationPointList<1> *)0x0;
  this_00 = gauss_legendre((size_t)domain_local);
  __end2 = std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
           begin(this_00);
  norm_point = (tuple<double,_double> *)
               std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
               ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
                                     *)&norm_point), bVar2) {
    local_60 = __gnu_cxx::
               __normal_iterator<std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
               ::operator*(&__end2);
    this = local_20;
    p_Var3 = std::get<0ul,double,double>(local_60);
    local_78 = Interval::parameter_at_normalized(this,*p_Var3);
    p_Var4 = std::get<1ul,double,double>(local_60);
    dVar1 = *p_Var4;
    local_80 = Interval::length(local_20);
    local_80 = dVar1 * local_80;
    std::tuple<double,_double>::tuple<double,_double,_true>(&local_70,&local_78,&local_80);
    this_01 = std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ::operator[](__return_storage_ptr__,(size_type)__range2);
    std::tuple<double,_double>::operator=(this_01,&local_70);
    __gnu_cxx::
    __normal_iterator<std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
    ::operator++(&__end2);
    __range2 = (IntegrationPointList<1> *)
               ((long)&(__range2->
                       super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<1> get(const size_t degree,
        const Interval& domain)
    {
        IntegrationPointList<1> integration_points(degree);

        Index i = 0;

        for (const auto& norm_point : gauss_legendre(degree)) {
            integration_points[i++] = IntegrationPoint<1>(
                domain.parameter_at_normalized(std::get<0>(norm_point)),
                std::get<1>(norm_point) * domain.length());
        }

        return integration_points;
    }